

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  long lVar3;
  pointer pAVar4;
  uint uVar5;
  ulong uVar6;
  bool *pbVar7;
  ulong uVar8;
  char *__args;
  pointer pAVar9;
  pointer pOVar10;
  char *pcVar11;
  bool bVar12;
  long lVar13;
  int iVar14;
  size_t sVar15;
  size_t arg_index;
  uint local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  char **local_48;
  pointer local_40;
  char *local_38;
  
  arg_index = 0;
  bVar12 = true;
  uVar6 = 1;
  local_60 = argc;
  local_48 = argv;
  do {
    if (argc <= (int)uVar6) {
      pAVar4 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar9 = (this->arguments_).
               super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((pAVar4 != pAVar9) && (pAVar9[-1].handled_count == 0)) {
        lVar3 = arg_index * 0x50 + 0x20;
        for (sVar15 = arg_index; sVar15 < (ulong)(((long)pAVar9 - (long)pAVar4) / 0x50);
            sVar15 = sVar15 + 1) {
          if (*(int *)((long)&(pAVar4->name)._M_dataplus._M_p + lVar3) != 2) {
            Errorf(this,"expected %s argument.",*(undefined8 *)((long)pAVar4 + lVar3 + -0x20));
            pAVar4 = (this->arguments_).
                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar9 = (this->arguments_).
                     super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          lVar3 = lVar3 + 0x50;
        }
      }
      return;
    }
    pcVar11 = local_48[(int)uVar6];
    if ((bVar12) && (*pcVar11 == '-')) {
      cVar1 = pcVar11[1];
      if (cVar1 == '\0') {
        HandleArgument(this,&arg_index,pcVar11);
        bVar12 = true;
      }
      else if (cVar1 == '-') {
        bVar12 = false;
        if (pcVar11[2] != '\0') {
          local_58 = 0;
          local_38 = pcVar11 + 2;
          local_40 = (this->options_).
                     super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          lVar3 = (long)(this->options_).
                        super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)local_40;
          pbVar7 = &local_40->has_argument;
          iVar14 = 0;
          local_5c = -1;
          local_50 = uVar6;
          for (lVar13 = 0; uVar6 = local_50, argc = local_60, lVar3 / 0x90 != lVar13;
              lVar13 = lVar13 + 1) {
            if (*(size_type *)(pbVar7 + -0x38) != 0) {
              iVar2 = Match(local_38,(string *)(pbVar7 + -0x40),*pbVar7);
              if (iVar14 < iVar2) {
                local_58 = 1;
                local_5c = (int)lVar13;
                iVar14 = iVar2;
              }
              else {
                local_58 = (ulong)((int)local_58 + (uint)(0 < iVar14 && iVar2 == iVar14));
              }
            }
            pbVar7 = pbVar7 + 0x90;
          }
          if ((int)local_58 < 2) {
            if ((int)local_58 == 0) {
              Errorf(this,"unknown option \'%s\'",pcVar11);
              goto LAB_0011cbb6;
            }
            lVar3 = (long)local_5c;
            if (local_40[lVar3].has_argument == true) {
              if ((pcVar11[(long)iVar14 + 1] == '\0') || (pcVar11[(long)iVar14 + 2] != '=')) {
                uVar5 = (int)local_50 + 1;
                if ((uVar5 == local_60) ||
                   (pcVar11 = local_48[(int)uVar5], uVar6 = (ulong)uVar5, *pcVar11 == '-')) {
                  Errorf(this,"option \'--%s\' requires argument",
                         local_40[lVar3].long_name._M_dataplus._M_p);
                  goto LAB_0011cb52;
                }
              }
              else {
                pcVar11 = pcVar11 + (long)iVar14 + 3;
              }
            }
            else {
              pcVar11 = (char *)0x0;
            }
            std::function<void_(const_char_*)>::operator()(&local_40[lVar3].callback,pcVar11);
            bVar12 = true;
          }
          else {
            Errorf(this,"ambiguous option \'%s\'",pcVar11);
            argc = local_60;
LAB_0011cb52:
            bVar12 = true;
            uVar6 = local_50;
          }
        }
      }
      else {
        lVar3 = 1;
        while (cVar1 != '\0') {
          for (pOVar10 = (this->options_).
                         super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pOVar10 !=
              (this->options_).
              super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
              ._M_impl.super__Vector_impl_data._M_finish; pOVar10 = pOVar10 + 1) {
            if (cVar1 == pOVar10->short_name) {
              if (pOVar10->has_argument != true) {
                __args = (char *)0x0;
                uVar8 = uVar6;
LAB_0011cb13:
                std::function<void_(const_char_*)>::operator()(&pOVar10->callback,__args);
                goto LAB_0011cb1c;
              }
              if (pcVar11[lVar3 + 1] == '\0') {
                uVar5 = (int)uVar6 + 1;
                if ((uVar5 != argc) &&
                   (__args = local_48[(int)uVar5], uVar8 = (ulong)uVar5, *__args != '-'))
                goto LAB_0011cb13;
              }
              Errorf(this,"option \'-%c\' requires argument",(ulong)(uint)(int)cVar1);
              break;
            }
          }
          Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)pcVar11[lVar3]);
          uVar8 = uVar6;
LAB_0011cb1c:
          lVar13 = lVar3 + 1;
          lVar3 = lVar3 + 1;
          uVar6 = uVar8;
          cVar1 = pcVar11[lVar13];
        }
LAB_0011cbb6:
        bVar12 = true;
      }
    }
    else {
      HandleArgument(this,&arg_index,pcVar11);
    }
    uVar6 = (ulong)((int)uVar6 + 1);
  } while( true );
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;
  bool processing_options = true;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (!processing_options || arg[0] != '-') {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
      continue;
    }

    if (arg[1] == '-') {
      if (arg[2] == '\0') {
        // -- on its own means stop processing args, everything should
        // be treated as positional.
        processing_options = false;
        continue;
      }
      // Long option.
      int best_index = -1;
      int best_length = 0;
      int best_count = 0;
      for (size_t j = 0; j < options_.size(); ++j) {
        const Option& option = options_[j];
        if (!option.long_name.empty()) {
          int match_length =
              Match(&arg[2], option.long_name, option.has_argument);
          if (match_length > best_length) {
            best_index = j;
            best_length = match_length;
            best_count = 1;
          } else if (match_length == best_length && best_length > 0) {
            best_count++;
          }
        }
      }

      if (best_count > 1) {
        Errorf("ambiguous option '%s'", arg);
        continue;
      } else if (best_count == 0) {
        Errorf("unknown option '%s'", arg);
        continue;
      }

      const Option& best_option = options_[best_index];
      const char* option_argument = nullptr;
      if (best_option.has_argument) {
        if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
            arg[best_length + 2] == '=') {  // +2 to skip "--".
          option_argument = &arg[best_length + 3];
        } else {
          if (i + 1 == argc || argv[i + 1][0] == '-') {
            Errorf("option '--%s' requires argument",
                   best_option.long_name.c_str());
            continue;
          }
          ++i;
          option_argument = argv[i];
        }
      }
      best_option.callback(option_argument);
    } else {
      // Short option.
      if (arg[1] == '\0') {
        // Just "-".
        HandleArgument(&arg_index, arg);
        continue;
      }

      // Allow short names to be combined, e.g. "-d -v" => "-dv".
      for (int k = 1; arg[k]; ++k) {
        bool matched = false;
        for (const Option& option : options_) {
          if (option.short_name && arg[k] == option.short_name) {
            const char* option_argument = nullptr;
            if (option.has_argument) {
              // A short option with a required argument cannot be followed
              // by other short options_.
              if (arg[k + 1] != '\0') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }

              if (i + 1 == argc || argv[i + 1][0] == '-') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }
              ++i;
              option_argument = argv[i];
            }
            option.callback(option_argument);
            matched = true;
            break;
          }
        }

        if (!matched) {
          Errorf("unknown option '-%c'", arg[k]);
          continue;
        }
      }
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      if (arguments_[i].count != ArgumentCount::ZeroOrMore) {
        Errorf("expected %s argument.", arguments_[i].name.c_str());
      }
    }
  }
}